

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.c
# Opt level: O0

bool_t rngTest(void)

{
  err_t eVar1;
  bool_t bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  size_t pos;
  size_t read;
  char hex [33];
  octet buf [2500];
  char *sources [5];
  undefined4 in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff55c;
  char *in_stack_fffffffffffff560;
  size_t *in_stack_fffffffffffff568;
  octet *poVar7;
  undefined4 in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff574;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  read_i in_stack_fffffffffffff598;
  octet *in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a8;
  uint in_stack_fffffffffffff5ac;
  uint in_stack_fffffffffffff5b0;
  uint in_stack_fffffffffffff5b4;
  ulong local_a48;
  ulong local_a40;
  octet local_a38 [48];
  octet local_a08 [8];
  octet *in_stack_fffffffffffff600;
  undefined8 local_38 [6];
  bool_t local_4;
  
  memcpy(local_38,&PTR_anon_var_dwarf_130f_001b9cd0,0x28);
  for (local_a48 = 0; local_a48 < 5; local_a48 = local_a48 + 1) {
    eVar1 = rngESRead(in_stack_fffffffffffff568,in_stack_fffffffffffff560,
                      CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),(char *)0x105ee9
                     );
    if (eVar1 == 0) {
      if (local_a40 == 0x9c4) {
        hexFrom(in_stack_fffffffffffff560,
                (void *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),0x105f18);
        in_stack_fffffffffffff598 = (read_i)local_38[local_a48];
        in_stack_fffffffffffff5a0 = local_a38;
        bVar2 = rngTestFIPS1((octet *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570))
        ;
        in_stack_fffffffffffff5ac = 0x2d;
        if (bVar2 != 0) {
          in_stack_fffffffffffff5ac = 0x2b;
        }
        bVar2 = rngTestFIPS2(in_stack_fffffffffffff5a0);
        in_stack_fffffffffffff5b0 = 0x2d;
        if (bVar2 != 0) {
          in_stack_fffffffffffff5b0 = 0x2b;
        }
        bVar2 = rngTestFIPS3(in_stack_fffffffffffff600);
        in_stack_fffffffffffff5b4 = 0x2d;
        if (bVar2 != 0) {
          in_stack_fffffffffffff5b4 = 0x2b;
        }
        bVar2 = rngTestFIPS4(local_a08);
        in_stack_fffffffffffff558 = 0x2d;
        if (bVar2 != 0) {
          in_stack_fffffffffffff558 = 0x2b;
        }
        printf("rngSource[%5s]: %s... [FIPS: 1%c 2%c 3%c 4%c]\n",in_stack_fffffffffffff598,
               in_stack_fffffffffffff5a0,(ulong)in_stack_fffffffffffff5ac,
               (ulong)in_stack_fffffffffffff5b0,(ulong)in_stack_fffffffffffff5b4);
      }
      else if (local_a40 < 0x11) {
        hexFrom(in_stack_fffffffffffff560,
                (void *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),0x10604b);
        printf("rngSource[%5s]: %s\n",local_38[local_a48],local_a38);
      }
      else {
        hexFrom(in_stack_fffffffffffff560,
                (void *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),0x10600b);
        printf("rngSource[%5s]: %s... (%u bytes)\n",local_38[local_a48],local_a38,
               local_a40 & 0xffffffff);
      }
    }
  }
  eVar1 = rngCreate(in_stack_fffffffffffff598,
                    (void *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
  if (eVar1 == 0) {
    bVar2 = rngIsValid();
    if (bVar2 == 0) {
      local_4 = 0;
    }
    else {
      rngStepR((void *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
               in_stack_fffffffffffff5a0);
      hexFrom(in_stack_fffffffffffff560,
              (void *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),0x1060ee);
      poVar7 = local_a38;
      bVar2 = rngTestFIPS1((octet *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
      uVar3 = 0x2d;
      if (bVar2 != 0) {
        uVar3 = 0x2b;
      }
      bVar2 = rngTestFIPS2(in_stack_fffffffffffff5a0);
      uVar4 = 0x2d;
      if (bVar2 != 0) {
        uVar4 = 0x2b;
      }
      bVar2 = rngTestFIPS3(in_stack_fffffffffffff600);
      uVar5 = 0x2d;
      if (bVar2 != 0) {
        uVar5 = 0x2b;
      }
      bVar2 = rngTestFIPS4(local_a08);
      uVar6 = 0x2d;
      if (bVar2 != 0) {
        uVar6 = 0x2b;
      }
      printf("rngStepR:         %s... [FIPS: 1%c 2%c 3%c 4%c]\n",poVar7,(ulong)uVar3,(ulong)uVar4,
             (ulong)uVar5,uVar6);
      rngRekey();
      rngStepR2(in_stack_fffffffffffff560,
                CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),(void *)0x1061bf);
      hexFrom(in_stack_fffffffffffff560,
              (void *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),0x1061d6);
      bVar2 = rngTestFIPS1((octet *)CONCAT44(uVar3,in_stack_fffffffffffff570));
      uVar3 = 0x2d;
      if (bVar2 != 0) {
        uVar3 = 0x2b;
      }
      bVar2 = rngTestFIPS2(in_stack_fffffffffffff5a0);
      uVar4 = 0x2d;
      if (bVar2 != 0) {
        uVar4 = 0x2b;
      }
      bVar2 = rngTestFIPS3(in_stack_fffffffffffff600);
      uVar5 = 0x2d;
      if (bVar2 != 0) {
        uVar5 = 0x2b;
      }
      bVar2 = rngTestFIPS4(local_a08);
      uVar6 = 0x2d;
      if (bVar2 != 0) {
        uVar6 = 0x2b;
      }
      printf("rngStepR2:        %s... [FIPS: 1%c 2%c 3%c 4%c]\n",local_a38,(ulong)uVar3,(ulong)uVar4
             ,(ulong)uVar5,uVar6);
      eVar1 = rngCreate(in_stack_fffffffffffff598,(void *)CONCAT44(uVar5,uVar4));
      if (eVar1 == 0) {
        rngClose();
        bVar2 = rngIsValid();
        if (bVar2 == 0) {
          local_4 = 0;
        }
        else {
          rngClose();
          bVar2 = rngIsValid();
          if (bVar2 == 0) {
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

bool_t rngTest()
{
	const char* sources[] = { "trng", "trng2", "sys", "sys2", "timer" };
	octet buf[2500];
	char hex[33];
	size_t read;
	size_t pos;
	// пробежать источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
	{
		if (rngESRead(&read, buf, 2500, sources[pos]) == ERR_OK)
		{
			if (read == 2500)
				hexFrom(hex, buf, 16),
				printf("rngSource[%5s]: %s... [FIPS: 1%c 2%c 3%c 4%c]\n",
					sources[pos],
					hex,
					rngTestFIPS1(buf) ? '+' : '-',
					rngTestFIPS2(buf) ? '+' : '-',
					rngTestFIPS3(buf) ? '+' : '-',
					rngTestFIPS4(buf) ? '+' : '-');
			else if (read > 16)
				hexFrom(hex, buf, 16),
				printf("rngSource[%5s]: %s... (%u bytes)\n",
					sources[pos], hex, (unsigned)read);
			else
				hexFrom(hex, buf, read),
				printf("rngSource[%5s]: %s\n", sources[pos], hex);
		}
	}
	// работа с ГСЧ
	if (rngCreate(0, 0) != ERR_OK)
		return FALSE;
	if (!rngIsValid())
		return FALSE;
	rngStepR(buf, 2500, 0);
	hexFrom(hex, buf, 16);
	printf("rngStepR:         %s... [FIPS: 1%c 2%c 3%c 4%c]\n",
		hex,
		rngTestFIPS1(buf) ? '+' : '-',
		rngTestFIPS2(buf) ? '+' : '-',
		rngTestFIPS3(buf) ? '+' : '-',
		rngTestFIPS4(buf) ? '+' : '-');
	rngRekey();
	rngStepR2(buf, 2500, 0);
	hexFrom(hex, buf, 16);
	printf("rngStepR2:        %s... [FIPS: 1%c 2%c 3%c 4%c]\n",
		hex,
		rngTestFIPS1(buf) ? '+' : '-',
		rngTestFIPS2(buf) ? '+' : '-',
		rngTestFIPS3(buf) ? '+' : '-',
		rngTestFIPS4(buf) ? '+' : '-');
	if (rngCreate(0, 0) != ERR_OK)
		return FALSE;
	rngClose();
	if (!rngIsValid())
		return FALSE;
	rngClose();
	if (rngIsValid())
		return FALSE;
	// все нормально
	return TRUE;
}